

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O3

bool __thiscall irr::scene::CSceneManager::isCulled(CSceneManager *this,ISceneNode *node)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  s32 i_1;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  long lVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 *puVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  u32 i;
  long lVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  matrix4 invTrans;
  aabbox3df nbox;
  float local_200 [4];
  float local_1f0;
  float local_1ec;
  CMatrix4<float> local_1e8;
  undefined8 local_1a8;
  float local_1a0;
  float local_19c;
  float local_198;
  float local_194;
  undefined8 local_190;
  float local_188;
  float local_184;
  float local_180;
  float local_17c;
  float local_178;
  float local_174;
  float local_170;
  undefined8 local_16c;
  float local_164;
  float local_160;
  float local_15c;
  float local_158;
  undefined8 local_154;
  float local_14c;
  SViewFrustum local_140;
  long *plVar7;
  
  iVar5 = (*(this->super_ISceneManager)._vptr_ISceneManager[0xe])();
  plVar7 = (long *)CONCAT44(extraout_var,iVar5);
  if (plVar7 == (long *)0x0) {
    return false;
  }
  uVar6 = node->AutomaticCullingState;
  if ((uVar6 & 8) != 0) {
    iVar5 = (*this->Driver->_vptr_IVideoDriver[0x21])(this->Driver,node);
    if (iVar5 == 0) {
      return true;
    }
    uVar6 = node->AutomaticCullingState;
  }
  if ((uVar6 & 1) == 0) {
    bVar4 = false;
  }
  else {
    iVar5 = (*node->_vptr_ISceneNode[7])(node);
    puVar9 = (undefined8 *)CONCAT44(extraout_var_00,iVar5);
    fVar12 = *(float *)(puVar9 + 1);
    uVar1 = *(undefined4 *)((long)puVar9 + 0x14);
    uVar2 = *puVar9;
    uVar3 = *(undefined8 *)((long)puVar9 + 0xc);
    iVar5 = (*node->_vptr_ISceneNode[10])(node);
    lVar8 = CONCAT44(extraout_var_01,iVar5);
    local_140.cameraPosition._0_8_ = uVar2;
    local_140.cameraPosition.Z = fVar12;
    local_1a8 = uVar3;
    local_1a0 = (float)uVar1;
    uVar2 = *(undefined8 *)(lVar8 + 0x30);
    local_200[0] = (float)uVar2;
    local_200[1] = SUB84(uVar2,4);
    local_1e8.M[0] = (float)uVar2;
    local_1e8.M[1] = SUB84(uVar2,4);
    local_200[2] = *(float *)(lVar8 + 0x38);
    local_1e8.M[2] = *(float *)(lVar8 + 0x38);
    lVar10 = 0;
    do {
      fVar12 = local_200[lVar10];
      fVar13 = local_1e8.M[lVar10];
      lVar11 = 0;
      do {
        fVar14 = *(float *)(lVar8 + lVar11 * 4);
        fVar16 = *(float *)((long)local_140.planes + lVar11 + -0xc) * fVar14;
        fVar14 = fVar14 * *(float *)((long)&local_1a8 + lVar11);
        fVar15 = fVar16;
        if (fVar14 <= fVar16) {
          fVar15 = fVar14;
        }
        fVar13 = fVar13 + fVar15;
        if (fVar14 <= fVar16) {
          fVar14 = fVar16;
        }
        fVar12 = fVar12 + fVar14;
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0xc);
      local_1e8.M[lVar10] = fVar13;
      local_200[lVar10] = fVar12;
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 4;
    } while (lVar10 != 3);
    fVar13 = local_1e8.M[0];
    fVar14 = local_1e8.M[1];
    fVar15 = local_1e8.M[2];
    fVar12 = local_200[0];
    local_1ec = local_200[1];
    local_1f0 = local_200[2];
    lVar8 = (**(code **)(*plVar7 + 0x1b0))(plVar7);
    if (*(float *)(lVar8 + 0x78) < fVar13) {
      return true;
    }
    if (*(float *)(lVar8 + 0x7c) < fVar14) {
      return true;
    }
    if (*(float *)(lVar8 + 0x80) < fVar15) {
      return true;
    }
    if (fVar12 < *(float *)(lVar8 + 0x6c)) {
      return true;
    }
    if (local_1ec < *(float *)(lVar8 + 0x70)) {
      return true;
    }
    bVar4 = local_1f0 < *(float *)(lVar8 + 0x74);
    if (bVar4) goto LAB_001c43a6;
  }
  if ((node->AutomaticCullingState & 4) != 0) {
    (*node->_vptr_ISceneNode[8])(&local_140,node);
    fVar12 = local_140.planes[0].Normal.X - local_140.cameraPosition.X;
    fVar13 = local_140.planes[0].Normal.Y - local_140.cameraPosition.Y;
    fVar14 = local_140.planes[0].Normal.Z - local_140.cameraPosition.Z;
    fVar15 = local_140.planes[0].Normal.X + local_140.cameraPosition.X;
    fVar16 = local_140.planes[0].Normal.Y + local_140.cameraPosition.Y;
    fVar17 = local_140.planes[0].Normal.Z + local_140.cameraPosition.Z;
    lVar8 = (**(code **)(*plVar7 + 0x1b0))(plVar7);
    fVar12 = SQRT(fVar14 * fVar14 + fVar12 * fVar12 + fVar13 * fVar13) * 0.5 +
             *(float *)(lVar8 + 0x104);
    lVar8 = (**(code **)(*plVar7 + 0x1b0))(plVar7);
    fVar15 = fVar15 * 0.5 - (float)*(undefined8 *)(lVar8 + 0x10c);
    fVar14 = fVar16 * 0.5 - (float)((ulong)*(undefined8 *)(lVar8 + 0x10c) >> 0x20);
    fVar13 = fVar17 * 0.5 - *(float *)(lVar8 + 0x114);
    bVar4 = fVar12 * fVar12 < fVar13 * fVar13 + fVar15 * fVar15 + fVar14 * fVar14;
  }
LAB_001c43a6:
  if (bVar4) {
    return true;
  }
  if ((node->AutomaticCullingState & 2) == 0) {
    return false;
  }
  puVar9 = (undefined8 *)(**(code **)(*plVar7 + 0x1b0))(plVar7);
  lVar8 = 0xc;
  do {
    *(undefined8 *)((long)local_140.planes + lVar8 + -0xc) = 0x3f80000000000000;
    *(undefined8 *)((long)(local_140.planes + -1) + 0xc + lVar8) = 0x8000000000000000;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x6c);
  lVar8 = 0x84;
  do {
    *(undefined8 *)((long)&local_140.planes[1].Normal.Z + lVar8) = 0;
    *(undefined8 *)((long)&local_140.planes[2].Normal.X + lVar8) = 0;
    *(undefined8 *)((long)&local_140.planes[0].Normal.Z + lVar8) = 0;
    *(undefined8 *)((long)&local_140.planes[1].Normal.X + lVar8) = 0;
    *(undefined8 *)((long)local_140.planes + lVar8 + -8) = 0;
    *(undefined8 *)((long)&local_140.planes[0].Normal.X + lVar8) = 0;
    *(undefined8 *)((long)&local_140.planes[2].Normal.Z + lVar8) = 0;
    *(undefined4 *)((long)&local_140.planes[3].Normal.X + lVar8) = 0x3f800000;
    *(undefined4 *)((long)&local_140.planes[1].D + lVar8) = 0x3f800000;
    *(undefined4 *)((long)&local_140.planes[0].Normal.Z + lVar8) = 0x3f800000;
    *(undefined4 *)((long)local_140.planes + lVar8 + -0xc) = 0x3f800000;
    lVar8 = lVar8 + 0x40;
  } while (lVar8 != 0x104);
  local_140.cameraPosition.Z = *(float *)(puVar9 + 1);
  local_140.cameraPosition._0_8_ = *puVar9;
  local_140.boundingBox.MaxEdge._4_8_ = *(undefined8 *)((long)puVar9 + 0x7c);
  local_140.boundingBox.MinEdge._0_8_ = *(undefined8 *)((long)puVar9 + 0x6c);
  local_140.boundingBox._8_8_ = *(undefined8 *)((long)puVar9 + 0x74);
  lVar8 = 0xc;
  do {
    uVar2 = ((undefined8 *)((long)puVar9 + lVar8))[1];
    *(undefined8 *)((long)local_140.planes + lVar8 + -0xc) = *(undefined8 *)((long)puVar9 + lVar8);
    *(undefined8 *)((long)(local_140.planes + -1) + 0xc + lVar8) = uVar2;
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x6c);
  local_140.Matrices[0].M._0_8_ = *(undefined8 *)((long)puVar9 + 0x84);
  local_140.Matrices[0].M._8_8_ = *(undefined8 *)((long)puVar9 + 0x8c);
  local_140.Matrices[0].M._16_8_ = *(undefined8 *)((long)puVar9 + 0x94);
  local_140.Matrices[0].M._24_8_ = *(undefined8 *)((long)puVar9 + 0x9c);
  local_140.Matrices[0].M._32_8_ = *(undefined8 *)((long)puVar9 + 0xa4);
  local_140.Matrices[0].M._40_8_ = *(undefined8 *)((long)puVar9 + 0xac);
  local_140.Matrices[0].M._48_8_ = *(undefined8 *)((long)puVar9 + 0xb4);
  local_140.Matrices[0].M._56_8_ = *(undefined8 *)((long)puVar9 + 0xbc);
  local_140.Matrices[1].M._0_8_ = *(undefined8 *)((long)puVar9 + 0xc4);
  local_140.Matrices[1].M._8_8_ = *(undefined8 *)((long)puVar9 + 0xcc);
  local_140.Matrices[1].M[4] = *(float *)((long)puVar9 + 0xd4);
  local_140.Matrices[1].M[5] = *(float *)(puVar9 + 0x1b);
  local_140.Matrices[1].M[6] = *(float *)((long)puVar9 + 0xdc);
  local_140.Matrices[1].M[7] = *(float *)(puVar9 + 0x1c);
  local_140.Matrices[1].M[8] = *(float *)((long)puVar9 + 0xe4);
  local_140.Matrices[1].M[9] = *(float *)(puVar9 + 0x1d);
  local_140.Matrices[1].M[10] = *(float *)((long)puVar9 + 0xec);
  local_140.Matrices[1].M[0xb] = *(float *)(puVar9 + 0x1e);
  local_140.Matrices[1].M[0xc] = *(float *)((long)puVar9 + 0xf4);
  local_140.Matrices[1].M[0xd] = *(float *)(puVar9 + 0x1f);
  local_140.Matrices[1].M[0xe] = *(float *)((long)puVar9 + 0xfc);
  local_140.Matrices[1].M[0xf] = *(float *)(puVar9 + 0x20);
  local_140._260_8_ = *(undefined8 *)((long)puVar9 + 0x104);
  local_140.BoundingCenter.Z = *(float *)((long)puVar9 + 0x114);
  local_140.BoundingCenter._0_8_ = *(undefined8 *)((long)puVar9 + 0x10c);
  iVar5 = (*node->_vptr_ISceneNode[10])(node);
  bVar4 = core::CMatrix4<float>::getInverse
                    ((CMatrix4<float> *)CONCAT44(extraout_var_02,iVar5),&local_1e8);
  if (!bVar4) {
    local_1e8.M[0xc] = 0.0;
    local_1e8.M[0xd] = 0.0;
    local_1e8.M[0xe] = 0.0;
    local_1e8.M[0xf] = 0.0;
    local_1e8.M[8] = 0.0;
    local_1e8.M[9] = 0.0;
    local_1e8.M[10] = 0.0;
    local_1e8.M[0xb] = 0.0;
    local_1e8.M[4] = 0.0;
    local_1e8.M[5] = 0.0;
    local_1e8.M[6] = 0.0;
    local_1e8.M[7] = 0.0;
    local_1e8.M[0] = 0.0;
    local_1e8.M[1] = 0.0;
    local_1e8.M[2] = 0.0;
    local_1e8.M[3] = 0.0;
  }
  lVar8 = 0xc;
  do {
    core::CMatrix4<float>::transformPlane
              (&local_1e8,(plane3d<float> *)((long)local_140.planes + lVar8 + -0xc));
    lVar8 = lVar8 + 0x10;
  } while (lVar8 != 0x6c);
  fVar12 = local_1e8.M[6] * local_140.cameraPosition.Y;
  fVar13 = local_1e8.M[2] * local_140.cameraPosition.X;
  fVar14 = local_1e8.M[4] * local_140.cameraPosition.Y;
  local_140.cameraPosition.Y =
       local_140.cameraPosition.Z * local_1e8.M[9] +
       local_140.cameraPosition.X * local_1e8.M[1] + local_1e8.M[5] * local_140.cameraPosition.Y +
       local_1e8.M[0xd];
  local_140.cameraPosition.X =
       local_140.cameraPosition.Z * local_1e8.M[8] +
       local_140.cameraPosition.X * local_1e8.M[0] + fVar14 + local_1e8.M[0xc];
  local_140.cameraPosition.Z =
       local_1e8.M[10] * local_140.cameraPosition.Z + fVar13 + fVar12 + local_1e8.M[0xe];
  SViewFrustum::recalculateBoundingBox(&local_140);
  iVar5 = (*node->_vptr_ISceneNode[7])(node);
  puVar9 = (undefined8 *)CONCAT44(extraout_var_03,iVar5);
  local_188 = (*(float *)(puVar9 + 1) + *(float *)((long)puVar9 + 0x14)) * 0.5;
  fVar12 = local_188 - *(float *)((long)puVar9 + 0x14);
  local_1a0 = local_188 + fVar12;
  fVar13 = (float)*(undefined8 *)((long)puVar9 + 0xc);
  fVar14 = (float)((ulong)*(undefined8 *)((long)puVar9 + 0xc) >> 0x20);
  local_178 = ((float)*puVar9 + fVar13) * 0.5;
  local_198 = ((float)((ulong)*puVar9 >> 0x20) + fVar14) * 0.5;
  fVar13 = local_178 - fVar13;
  fVar14 = local_198 - fVar14;
  local_19c = local_178 + fVar13;
  local_174 = local_198 + fVar14;
  local_1a8 = CONCAT44(local_174,local_19c);
  local_194 = local_1a0;
  local_188 = local_188 - fVar12;
  local_190 = CONCAT44(local_174,local_19c);
  local_184 = local_19c;
  local_17c = local_188;
  local_170 = local_1a0;
  local_178 = local_178 - fVar13;
  local_198 = local_198 - fVar14;
  local_180 = local_198;
  local_16c = CONCAT44(local_198,local_178);
  local_164 = local_1a0;
  local_160 = local_178;
  local_15c = local_174;
  local_158 = local_188;
  local_154 = CONCAT44(local_198,local_178);
  local_14c = local_188;
  lVar8 = 0;
  do {
    lVar10 = 8;
    while ((fVar12 = *(float *)((long)&local_1a8 + lVar10) * local_140.planes[lVar8].Normal.Z +
                     *(float *)((long)local_1e8.M + lVar10 + 0x38) *
                     local_140.planes[lVar8].Normal.X +
                     *(float *)((long)local_1e8.M + lVar10 + 0x3c) *
                     local_140.planes[lVar8].Normal.Y + local_140.planes[lVar8].D, -1e-06 <= fVar12
           && (1e-06 < fVar12))) {
      lVar10 = lVar10 + 0xc;
      if (lVar10 == 0x68) {
        return true;
      }
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 6);
  return false;
}

Assistant:

bool CSceneManager::isCulled(const ISceneNode *node) const
{
	const ICameraSceneNode *cam = getActiveCamera();
	if (!cam) {
		return false;
	}
	bool result = false;

	// has occlusion query information
	if (node->getAutomaticCulling() & scene::EAC_OCC_QUERY) {
		result = (Driver->getOcclusionQueryResult(const_cast<ISceneNode *>(node)) == 0);
	}

	// can be seen by a bounding box ?
	if (!result && (node->getAutomaticCulling() & scene::EAC_BOX)) {
		core::aabbox3d<f32> tbox = node->getBoundingBox();
		node->getAbsoluteTransformation().transformBoxEx(tbox);
		result = !(tbox.intersectsWithBox(cam->getViewFrustum()->getBoundingBox()));
	}

	// can be seen by a bounding sphere
	if (!result && (node->getAutomaticCulling() & scene::EAC_FRUSTUM_SPHERE)) {
		const core::aabbox3df nbox = node->getTransformedBoundingBox();
		const float rad = nbox.getRadius();
		const core::vector3df center = nbox.getCenter();

		const float camrad = cam->getViewFrustum()->getBoundingRadius();
		const core::vector3df camcenter = cam->getViewFrustum()->getBoundingCenter();

		const float dist = (center - camcenter).getLengthSQ();
		const float maxdist = (rad + camrad) * (rad + camrad);

		result = dist > maxdist;
	}

	// can be seen by cam pyramid planes ?
	if (!result && (node->getAutomaticCulling() & scene::EAC_FRUSTUM_BOX)) {
		SViewFrustum frust = *cam->getViewFrustum();

		// transform the frustum to the node's current absolute transformation
		core::matrix4 invTrans(node->getAbsoluteTransformation(), core::matrix4::EM4CONST_INVERSE);
		// invTrans.makeInverse();
		frust.transform(invTrans);

		core::vector3df edges[8];
		node->getBoundingBox().getEdges(edges);

		for (s32 i = 0; i < scene::SViewFrustum::VF_PLANE_COUNT; ++i) {
			bool boxInFrustum = false;
			for (u32 j = 0; j < 8; ++j) {
				if (frust.planes[i].classifyPointRelation(edges[j]) != core::ISREL3D_FRONT) {
					boxInFrustum = true;
					break;
				}
			}

			if (!boxInFrustum) {
				result = true;
				break;
			}
		}
	}

	return result;
}